

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O1

void __thiscall
duckdb::ListColumnCheckpointState::~ListColumnCheckpointState(ListColumnCheckpointState *this)

{
  _Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false> _Var1;
  
  (this->super_ColumnCheckpointState)._vptr_ColumnCheckpointState =
       (_func_int **)&PTR__ListColumnCheckpointState_02491fd0;
  _Var1._M_head_impl =
       (this->child_state).
       super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
       .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (ColumnCheckpointState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ColumnCheckpointState + 8))();
  }
  (this->child_state).
  super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
  .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl =
       (ColumnCheckpointState *)0x0;
  _Var1._M_head_impl =
       (this->validity_state).
       super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
       .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (ColumnCheckpointState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ColumnCheckpointState + 8))();
  }
  (this->validity_state).
  super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
  .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl =
       (ColumnCheckpointState *)0x0;
  ColumnCheckpointState::~ColumnCheckpointState(&this->super_ColumnCheckpointState);
  operator_delete(this);
  return;
}

Assistant:

ListColumnCheckpointState(RowGroup &row_group, ColumnData &column_data, PartialBlockManager &partial_block_manager)
	    : ColumnCheckpointState(row_group, column_data, partial_block_manager) {
		global_stats = ListStats::CreateEmpty(column_data.type).ToUnique();
	}